

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

_Bool golf_script_get_val(golf_script_t *script,char *name,gs_val_t *val)

{
  map_base_t *m;
  vec2 vVar1;
  map_node_t **ppmVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)(script->eval).env.length;
  do {
    iVar3 = (int)uVar4;
    if (iVar3 < 1) goto LAB_00137cbc;
    m = (map_base_t *)(script->eval).env.data[uVar4 - 1];
    uVar4 = uVar4 - 1;
    ppmVar2 = (map_node_t **)map_get_(m,name);
    m[1].buckets = ppmVar2;
  } while (ppmVar2 == (map_node_t **)0x0);
  *(map_node_t **)((long)&val->field_2 + 8) = ppmVar2[2];
  vVar1 = *(vec2 *)(ppmVar2 + 1);
  *(map_node_t **)val = *ppmVar2;
  (val->field_2).vec2_val = vVar1;
LAB_00137cbc:
  return 0 < iVar3;
}

Assistant:

bool golf_script_get_val(golf_script_t *script, const char *name, gs_val_t *val) {
    for (int i = script->eval.env.length - 1; i >= 0; i--) {
        gs_env_t *env = script->eval.env.data[i];
        gs_val_t *val0 = map_get(&env->val_map, name);
        if (val0) {
            *val = *val0;
            return true;
        }
    }
    return false;
}